

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_authorization.c
# Opt level: O3

IOTHUB_CREDENTIAL_TYPE
IoTHubClient_Auth_Set_x509_Type(IOTHUB_AUTHORIZATION_HANDLE handle,_Bool enable_x509)

{
  if (handle != (IOTHUB_AUTHORIZATION_HANDLE)0x0) {
    if (enable_x509) {
      handle->cred_type = IOTHUB_CREDENTIAL_TYPE_X509;
      return IOTHUB_CREDENTIAL_TYPE_X509;
    }
    if (handle->device_sas_token == (char *)0x0) {
      handle->cred_type = IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY;
      return IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY;
    }
    if (handle->device_key == (char *)0x0) {
      handle->cred_type = IOTHUB_CREDENTIAL_TYPE_SAS_TOKEN;
      return IOTHUB_CREDENTIAL_TYPE_SAS_TOKEN;
    }
    handle->cred_type = IOTHUB_CREDENTIAL_TYPE_UNKNOWN;
  }
  return IOTHUB_CREDENTIAL_TYPE_UNKNOWN;
}

Assistant:

IOTHUB_CREDENTIAL_TYPE IoTHubClient_Auth_Set_x509_Type(IOTHUB_AUTHORIZATION_HANDLE handle, bool enable_x509)
{
    IOTHUB_CREDENTIAL_TYPE result;
    if (handle != NULL)
    {
        if (enable_x509)
        {
            result = handle->cred_type = IOTHUB_CREDENTIAL_TYPE_X509;
        }
        else
        {
            if (handle->device_sas_token == NULL)
            {
                result = handle->cred_type = IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY;
            }
            else if (handle->device_key == NULL)
            {
                result = handle->cred_type = IOTHUB_CREDENTIAL_TYPE_SAS_TOKEN;
            }
            else
            {
                result = handle->cred_type = IOTHUB_CREDENTIAL_TYPE_UNKNOWN;
            }
        }
    }
    else
    {
        result = IOTHUB_CREDENTIAL_TYPE_UNKNOWN;
    }
    return result;
}